

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseNotationDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  notationDeclSAXFunc p_Var3;
  xmlType xVar4;
  int iVar5;
  xmlChar *in_RAX;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlParserInputPtr pxVar8;
  char *msg;
  xmlChar *Pubid;
  
  xVar4 = ctxt->mlType;
  if (xVar4 == XML_TYPE_SML) {
    pxVar8 = ctxt->input;
    pxVar6 = pxVar8->cur;
    if (*pxVar6 != '!') {
      return;
    }
    if (pxVar6[1] != 'N') {
      return;
    }
    if (pxVar6[2] != 'O') {
      return;
    }
    if (pxVar6[3] != 'T') {
      return;
    }
    if (pxVar6[4] != 'A') {
      return;
    }
    if (pxVar6[5] != 'T') {
      return;
    }
    if (pxVar6[6] != 'I') {
      return;
    }
    if (pxVar6[7] != 'O') {
      return;
    }
    xVar1 = pxVar6[8];
  }
  else {
    if (xVar4 != XML_TYPE_XML) {
      return;
    }
    pxVar8 = ctxt->input;
    pxVar6 = pxVar8->cur;
    if (*pxVar6 != '<') {
      return;
    }
    if (pxVar6[1] != '!') {
      return;
    }
    if (pxVar6[2] != 'N') {
      return;
    }
    if (pxVar6[3] != 'O') {
      return;
    }
    if (pxVar6[4] != 'T') {
      return;
    }
    if (pxVar6[5] != 'A') {
      return;
    }
    if (pxVar6[6] != 'T') {
      return;
    }
    if (pxVar6[7] != 'I') {
      return;
    }
    if (pxVar6[8] != 'O') {
      return;
    }
    xVar1 = pxVar6[9];
  }
  if (xVar1 != 'N') {
    return;
  }
  iVar2 = pxVar8->id;
  Pubid = in_RAX;
  if (((ctxt->progressive == 0) && (500 < (long)pxVar6 - (long)pxVar8->base)) &&
     ((long)pxVar8->end - (long)pxVar6 < 500)) {
    xmlSHRINK(ctxt);
    xVar4 = ctxt->mlType;
    pxVar8 = ctxt->input;
  }
  pxVar6 = pxVar8->cur;
  pxVar8->cur = pxVar6 + (ulong)(xVar4 == XML_TYPE_XML) + 9;
  pxVar8->col = (uint)(xVar4 == XML_TYPE_XML) + pxVar8->col + 9;
  if (pxVar6[(ulong)(xVar4 == XML_TYPE_XML) + 9] == '\0') {
    xmlParserInputGrow(pxVar8,0xfa);
  }
  iVar5 = xmlSkipBlankChars(ctxt);
  if (iVar5 == 0) {
    msg = "Space required after \'<!NOTATION\'\n";
LAB_0015dcec:
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,msg);
    return;
  }
  pxVar6 = xmlParseName(ctxt);
  if (pxVar6 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
    return;
  }
  pxVar7 = xmlStrchr(pxVar6,':');
  if (pxVar7 != (xmlChar *)0x0) {
    xmlNsErr(ctxt,XML_NS_ERR_COLON,"colons are forbidden from notation names \'%s\'\n",pxVar6,
             (xmlChar *)0x0,(xmlChar *)0x0);
  }
  iVar5 = xmlSkipBlankChars(ctxt);
  if (iVar5 == 0) {
    msg = "Space required after the NOTATION name\'\n";
    goto LAB_0015dcec;
  }
  pxVar7 = xmlParseExternalID(ctxt,&Pubid,0);
  xmlSkipBlankChars(ctxt);
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar8 = ctxt->input;
    if ((*pxVar8->cur == ';') || (*pxVar8->cur == '\n')) goto LAB_0015dd16;
  }
  else if ((ctxt->mlType == XML_TYPE_XML) && (pxVar8 = ctxt->input, *pxVar8->cur == '>')) {
LAB_0015dd16:
    if (iVar2 != pxVar8->id) {
      xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                     "Notation declaration doesn\'t start and stop in the same entity\n");
    }
    xmlNextChar(ctxt);
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var3 = ctxt->sax->notationDecl, p_Var3 != (notationDeclSAXFunc)0x0)) {
      (*p_Var3)(ctxt->userData,pxVar6,Pubid,pxVar7);
    }
    goto LAB_0015dd6e;
  }
  xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
LAB_0015dd6e:
  if (pxVar7 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar7);
  }
  if (Pubid == (xmlChar *)0x0) {
    return;
  }
  (*xmlFree)(Pubid);
  return;
}

Assistant:

void
xmlParseNotationDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *Pubid;
    xmlChar *Systemid;

    if (CMP10_MLI(CUR_PTR, '<', '!', 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	int inputid = ctxt->input->id;
	SHRINK;
	SKIP_MLI(10);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!NOTATION'\n");
	    return;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	    return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from notation names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		     "Space required after the NOTATION name'\n");
	    return;
	}

	/*
	 * Parse the IDs.
	 */
	Systemid = xmlParseExternalID(ctxt, &Pubid, 0);
	SKIP_BLANKS;

	if (RAW_IS_GT_MLI) { /* RAW == '>' */
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Notation declaration doesn't start and stop"
                               " in the same entity\n");
	    }
	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->notationDecl != NULL))
		ctxt->sax->notationDecl(ctxt->userData, name, Pubid, Systemid);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
	}
	if (Systemid != NULL) xmlFree(Systemid);
	if (Pubid != NULL) xmlFree(Pubid);
    }
}